

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btMultiBodySolverConstraint>::copy
          (btAlignedObjectArray<btMultiBodySolverConstraint> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  void *__dest;
  long in_RCX;
  int i;
  int local_1c;
  
  for (local_1c = (int)dst; local_1c < (int)src; local_1c = local_1c + 1) {
    __dest = btMultiBodySolverConstraint::operator_new
                       (0xe0,(void *)(in_RCX + (long)local_1c * 0xe0));
    memcpy(__dest,(void *)(*(long *)(this + 0x10) + (long)local_1c * 0xe0),0xe0);
  }
  return local_1c;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}